

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void build_btree_sampler<double>
               (vector<double,_std::allocator<double>_> *btree_weights,double *sample_weights,
               size_t nrows,size_t *log2_n,size_t *btree_offset)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  reference pvVar4;
  size_type sVar5;
  size_t *in_RCX;
  size_t in_RDX;
  long in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  long *in_R8;
  double dVar6;
  size_t ix_1;
  size_t ix;
  size_type in_stack_ffffffffffffff98;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa0;
  value_type vVar7;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffb0;
  size_type local_48;
  value_type_conflict *in_stack_ffffffffffffffc0;
  ulong uVar8;
  size_type in_stack_ffffffffffffffc8;
  
  sVar3 = log2ceil(in_RDX);
  *in_RCX = sVar3;
  bVar1 = std::vector<double,_std::allocator<double>_>::empty(in_stack_ffffffffffffffb0);
  if (bVar1) {
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)0x0,in_stack_ffffffffffffffc8,
               in_stack_ffffffffffffffc0);
  }
  else {
    std::vector<double,_std::allocator<double>_>::size(in_RDI);
    std::vector<double,_std::allocator<double>_>::assign
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(value_type_conflict *)0x1dc5cf);
  }
  *in_R8 = (1L << ((byte)*in_RCX & 0x3f)) + -1;
  for (uVar8 = 0; uVar8 < in_RDX; uVar8 = uVar8 + 1) {
    dVar6 = *(double *)(in_RSI + uVar8 * 8);
    if (dVar6 <= 0.0) {
      dVar6 = 0.0;
    }
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,uVar8 + *in_R8);
    *pvVar4 = dVar6;
  }
  sVar5 = std::vector<double,_std::allocator<double>_>::size(in_RDI);
  while (local_48 = sVar5 - 1, local_48 != 0) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_48);
    vVar7 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,sVar5 - 2 >> 1);
    *pvVar4 = vVar7 + *pvVar4;
    sVar5 = local_48;
  }
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,0);
  uVar2 = std::isnan(*pvVar4);
  if (((uVar2 & 1) == 0) &&
     (pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,0), 0.0 < *pvVar4)) {
    return;
  }
  fprintf(_stderr,"%s","Numeric precision error with sample weights, will not use them.\n");
  *in_RCX = 0;
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x1dc71f);
  std::vector<double,_std::allocator<double>_>::shrink_to_fit
            ((vector<double,_std::allocator<double>_> *)0x1dc729);
  return;
}

Assistant:

void build_btree_sampler(std::vector<double> &btree_weights, real_t *restrict sample_weights,
                         size_t nrows, size_t &restrict log2_n, size_t &restrict btree_offset)
{
    /* build a perfectly-balanced binary search tree in which each node will
       hold the sum of the weights of its children */
    log2_n = log2ceil(nrows);
    if (btree_weights.empty())
        btree_weights.resize(pow2(log2_n + 1), 0);
    else
        btree_weights.assign(btree_weights.size(), 0);
    btree_offset = pow2(log2_n) - 1;

    for (size_t ix = 0; ix < nrows; ix++)
        btree_weights[ix + btree_offset] = std::fmax(0., sample_weights[ix]);
    for (size_t ix = btree_weights.size() - 1; ix > 0; ix--)
        btree_weights[ix_parent(ix)] += btree_weights[ix];
    
    if (std::isnan(btree_weights[0]) || btree_weights[0] <= 0)
    {
        print_errmsg("Numeric precision error with sample weights, will not use them.\n");
        log2_n = 0;
        btree_weights.clear();
        btree_weights.shrink_to_fit();
    }
}